

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Unload(Map *this)

{
  Character *pCVar1;
  Arena *this_00;
  bool bVar2;
  reference ppNVar3;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *this_01;
  pointer pNVar4;
  vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_> *this_02;
  reference ppAVar5;
  Arena_Spawn *spawn;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_> *__range2_1;
  iterator local_80;
  const_iterator local_78;
  _List_node_base *local_70;
  _List_iterator<NPC_*> local_68;
  iterator local_60;
  const_iterator local_58;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *local_50;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent;
  iterator __end2;
  iterator __begin2;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range2;
  NPC *npc;
  iterator __end1;
  iterator __begin1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1;
  Map *this_local;
  
  this->exists = false;
  __end1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&this->npcs);
  npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->npcs);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                     *)&npc), bVar2) {
    ppNVar3 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
              operator*(&__end1);
    __range2 = (list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                *)*ppNVar3;
    this_01 = &((NPC *)__range2)->damagelist;
    __end2 = std::__cxx11::
             list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
             ::begin(this_01);
    opponent = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
               std::__cxx11::
               list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
               ::end(this_01);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&opponent), bVar2) {
      local_50 = std::
                 _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>
                 ::operator*(&__end2);
      pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (local_50);
      pCVar1 = pNVar4->attacker;
      pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (local_50);
      local_68._M_node =
           (_List_node_base *)
           std::begin<std::__cxx11::list<NPC*,std::allocator<NPC*>>>
                     (&pNVar4->attacker->unregister_npc);
      pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (local_50);
      local_70 = (_List_node_base *)
                 std::end<std::__cxx11::list<NPC*,std::allocator<NPC*>>>
                           (&pNVar4->attacker->unregister_npc);
      local_60._M_node =
           (_List_node_base *)
           std::remove<std::_List_iterator<NPC*>,NPC*>
                     (local_68,(_List_iterator<NPC_*>)local_70,(NPC **)&__range2);
      std::_List_const_iterator<NPC_*>::_List_const_iterator(&local_58,&local_60);
      pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (local_50);
      local_80._M_node =
           (_List_node_base *)
           std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::end(&pNVar4->attacker->unregister_npc)
      ;
      std::_List_const_iterator<NPC_*>::_List_const_iterator(&local_78,&local_80);
      std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                (&pCVar1->unregister_npc,local_58,local_78);
      std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1);
  }
  std::vector<NPC_*,_std::allocator<NPC_*>_>::clear(&this->npcs);
  if (this->arena != (Arena *)0x0) {
    this_02 = &this->arena->spawns;
    __end2_1 = std::vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>::begin(this_02);
    spawn = (Arena_Spawn *)std::vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Arena_Spawn_**,_std::vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>_>
                               *)&spawn), bVar2) {
      ppAVar5 = __gnu_cxx::
                __normal_iterator<Arena_Spawn_**,_std::vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>_>
                ::operator*(&__end2_1);
      if (*ppAVar5 != (Arena_Spawn *)0x0) {
        operator_delete(*ppAVar5,4);
      }
      __gnu_cxx::
      __normal_iterator<Arena_Spawn_**,_std::vector<Arena_Spawn_*,_std::allocator<Arena_Spawn_*>_>_>
      ::operator++(&__end2_1);
    }
    this_00 = this->arena;
    if (this_00 != (Arena *)0x0) {
      Arena::~Arena(this_00);
      operator_delete(this_00,0x38);
    }
  }
  this->arena = (Arena *)0x0;
  std::vector<std::shared_ptr<Map_Chest>,_std::allocator<std::shared_ptr<Map_Chest>_>_>::clear
            (&this->chests);
  std::vector<Map_Tile,_std::allocator<Map_Tile>_>::clear(&this->tiles);
  return;
}

Assistant:

void Map::Unload()
{
	this->exists = false;

	UTIL_FOREACH(this->npcs, npc)
	{
		UTIL_FOREACH_CREF(npc->damagelist, opponent)
		{
			opponent->attacker->unregister_npc.erase(
				std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), npc),
				opponent->attacker->unregister_npc.end()
			);
		}
	}

	this->npcs.clear();

	if (this->arena)
	{
		UTIL_FOREACH(this->arena->spawns, spawn)
			delete spawn;

		delete this->arena;
	}

	this->arena = nullptr;

	this->chests.clear();
	this->tiles.clear();
}